

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Sphere * pbrt::Sphere::Create
                   (Transform *renderFromObject,Transform *objectFromRender,bool reverseOrientation,
                   ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  Sphere *pSVar2;
  undefined1 auVar3 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  bool reverseOrientation_local;
  allocator<char> local_7d;
  Float zmin;
  Float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  string local_60;
  Float local_40;
  Float phimax;
  Float zmax;
  Float radius;
  Transform *objectFromRender_local;
  Transform *renderFromObject_local;
  Allocator alloc_local;
  
  reverseOrientation_local = reverseOrientation;
  objectFromRender_local = objectFromRender;
  renderFromObject_local = renderFromObject;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"radius",(allocator<char> *)&zmin);
  local_78 = ParameterDictionary::GetOneFloat(parameters,&local_60,1.0);
  uStack_74 = extraout_XMM0_Db;
  uStack_70 = extraout_XMM0_Dc;
  uStack_6c = extraout_XMM0_Dd;
  std::__cxx11::string::~string((string *)&local_60);
  radius = local_78;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"zmin",(allocator<char> *)&zmax);
  auVar1._4_4_ = uStack_74;
  auVar1._0_4_ = local_78;
  auVar1._8_4_ = uStack_70;
  auVar1._12_4_ = uStack_6c;
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar1,auVar3);
  local_40 = ParameterDictionary::GetOneFloat(parameters,&local_60,auVar3._0_4_);
  std::__cxx11::string::~string((string *)&local_60);
  zmin = local_40;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"zmax",(allocator<char> *)&phimax);
  local_78 = ParameterDictionary::GetOneFloat(parameters,&local_60,local_78);
  std::__cxx11::string::~string((string *)&local_60);
  zmax = local_78;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"phimax",&local_7d);
  local_78 = ParameterDictionary::GetOneFloat(parameters,&local_60,360.0);
  std::__cxx11::string::~string((string *)&local_60);
  phimax = local_78;
  pSVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::Sphere,pbrt::Transform_const*&,pbrt::Transform_const*&,bool&,float&,float&,float&,float&>
                     (&alloc_local,&renderFromObject_local,&objectFromRender_local,
                      &reverseOrientation_local,&radius,&zmin,(float *)&zmax,(float *)&phimax);
  return pSVar2;
}

Assistant:

Sphere *Sphere::Create(const Transform *renderFromObject,
                       const Transform *objectFromRender, bool reverseOrientation,
                       const ParameterDictionary &parameters, const FileLoc *loc,
                       Allocator alloc) {
    Float radius = parameters.GetOneFloat("radius", 1.f);
    Float zmin = parameters.GetOneFloat("zmin", -radius);
    Float zmax = parameters.GetOneFloat("zmax", radius);
    Float phimax = parameters.GetOneFloat("phimax", 360.f);
    return alloc.new_object<Sphere>(renderFromObject, objectFromRender,
                                    reverseOrientation, radius, zmin, zmax, phimax);
}